

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::optimizeStageIO(TIntermediate *this,TInfoSink *param_1,TIntermediate *unit)

{
  TDestinationStack *this_00;
  char *__s;
  _List_node_base *p_Var1;
  TIntermNode *pTVar2;
  TIntermNode *pTVar3;
  pointer ppTVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  TQualifier *pTVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__rhs;
  undefined4 extraout_var_04;
  long lVar10;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var11;
  anon_class_8_1_65350a3f demoteMatchingInputs;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var12;
  long lVar13;
  pointer ppTVar14;
  TIntermNode *local_348;
  pointer local_340;
  pointer local_338;
  TIntermSequence unitAllInputs;
  TIntermSequence unitLiveInputs;
  TIntermSequence allOutputs;
  TIOTraverser unitTraverser;
  TIOTraverser unitAllTraverser;
  TIOTraverser allTraverser;
  undefined4 extraout_var_01;
  
  if (((int)this->language < 5) && ((int)unit->language < 5)) {
    TVector<TIntermNode_*>::TVector(&unitLiveInputs);
    optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::TIOTraverser::TIOTraverser(glslang::
    TIntermediate&,bool,glslang::TVector<TIntermNode*>&,glslang::TStorageQualifier_
              (&unitTraverser,unit,false,&unitLiveInputs,EvqVaryingIn);
    __s = (unit->entryPointMangledName)._M_dataplus._M_p;
    unitAllTraverser.super_TLiveTraverser.super_TIntermTraverser._vptr_TIntermTraverser =
         (_func_int **)GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               &allTraverser,__s,(pool_allocator<char> *)&unitAllTraverser);
    TLiveTraverser::pushFunction(&unitTraverser.super_TLiveTraverser,(TString *)&allTraverser);
    this_00 = &unitTraverser.super_TLiveTraverser.destinations;
    while (unitTraverser.super_TLiveTraverser.destinations.
           super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
           ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
      p_Var1 = unitTraverser.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
      std::__cxx11::list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
      ::pop_back(this_00);
      (*(code *)p_Var1->_M_next[1]._M_next)(p_Var1,&unitTraverser);
    }
    TVector<TIntermNode_*>::TVector(&allOutputs);
    TVector<TIntermNode_*>::TVector(&unitAllInputs);
    optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::TIOTraverser::TIOTraverser(glslang::
    TIntermediate&,bool,glslang::TVector<TIntermNode*>&,glslang::TStorageQualifier_
              (&allTraverser,this,true,&allOutputs,EvqVaryingOut);
    (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&allTraverser);
    optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::TIOTraverser::TIOTraverser(glslang::
    TIntermediate&,bool,glslang::TVector<TIntermNode*>&,glslang::TStorageQualifier_
              (&unitAllTraverser,unit,true,&unitAllInputs,EvqVaryingIn);
    (*unit->treeRoot->_vptr_TIntermNode[2])();
    local_340 = allOutputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    while (allOutputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
           super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
           super__Vector_impl_data._M_start != local_340) {
      pTVar2 = *allOutputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_338 = allOutputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
      iVar6 = (*pTVar2->_vptr_TIntermNode[0xc])(pTVar2);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x1a0))
                         ((long *)CONCAT44(extraout_var,iVar6));
      iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (pbVar7,0,3,"gl_");
      if (iVar6 != 0) {
        iVar6 = (*pTVar2->_vptr_TIntermNode[0xc])(pTVar2);
        iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x100))
                          ((long *)CONCAT44(extraout_var_00,iVar6));
        ppTVar4 = unitLiveInputs.
                  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
        if (iVar6 != 0x10) {
          lVar13 = (long)unitLiveInputs.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)unitLiveInputs.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          _Var12._M_current =
               unitLiveInputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_348 = pTVar2;
          for (lVar10 = lVar13 >> 5; _Var11._M_current = _Var12._M_current, 0 < lVar10;
              lVar10 = lVar10 + -1) {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                  *)&local_348,_Var12);
            if (bVar5) goto LAB_002fe285;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                  *)&local_348,
                                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )(_Var12._M_current + 1));
            _Var11._M_current = _Var12._M_current + 1;
            if (bVar5) goto LAB_002fe285;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                  *)&local_348,
                                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )(_Var12._M_current + 2));
            _Var11._M_current = _Var12._M_current + 2;
            if (bVar5) goto LAB_002fe285;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                  *)&local_348,
                                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )(_Var12._M_current + 3));
            _Var11._M_current = _Var12._M_current + 3;
            if (bVar5) goto LAB_002fe285;
            _Var12._M_current = _Var12._M_current + 4;
            lVar13 = lVar13 + -0x20;
          }
          lVar13 = lVar13 >> 3;
          if (lVar13 == 1) {
LAB_002fe47e:
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                  *)&local_348,_Var12);
            _Var11._M_current = _Var12._M_current;
            if (!bVar5) {
              _Var11._M_current = ppTVar4;
            }
LAB_002fe285:
            if (_Var11._M_current != ppTVar4) goto LAB_002fe344;
          }
          else {
            if (lVar13 == 2) {
LAB_002fe466:
              bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                    *)&local_348,_Var12);
              _Var11._M_current = _Var12._M_current;
              if (!bVar5) {
                _Var12._M_current = _Var12._M_current + 1;
                goto LAB_002fe47e;
              }
              goto LAB_002fe285;
            }
            if (lVar13 == 3) {
              bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                    *)&local_348,_Var12);
              if (!bVar5) {
                _Var12._M_current = _Var12._M_current + 1;
                goto LAB_002fe466;
              }
              goto LAB_002fe285;
            }
          }
          ppTVar4 = unitAllInputs.
                    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar13 = (long)unitAllInputs.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)unitAllInputs.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          _Var12._M_current =
               unitAllInputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_348 = pTVar2;
          for (lVar10 = lVar13 >> 5; _Var11._M_current = _Var12._M_current, 0 < lVar10;
              lVar10 = lVar10 + -1) {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                  *)&local_348,_Var12);
            if (bVar5) goto LAB_002fe33f;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                  *)&local_348,
                                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )(_Var12._M_current + 1));
            _Var11._M_current = _Var12._M_current + 1;
            if (bVar5) goto LAB_002fe33f;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                  *)&local_348,
                                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )(_Var12._M_current + 2));
            _Var11._M_current = _Var12._M_current + 2;
            if (bVar5) goto LAB_002fe33f;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                  *)&local_348,
                                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )(_Var12._M_current + 3));
            _Var11._M_current = _Var12._M_current + 3;
            if (bVar5) goto LAB_002fe33f;
            _Var12._M_current = _Var12._M_current + 4;
            lVar13 = lVar13 + -0x20;
          }
          lVar13 = lVar13 >> 3;
          if (lVar13 == 1) {
LAB_002fe4ba:
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                    ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                  *)&local_348,_Var12);
            _Var11._M_current = _Var12._M_current;
            if (!bVar5) {
              _Var11._M_current = ppTVar4;
            }
LAB_002fe33f:
            if (_Var11._M_current != ppTVar4) goto LAB_002fe344;
          }
          else {
            if (lVar13 == 2) {
LAB_002fe4a2:
              bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                    *)&local_348,_Var12);
              _Var11._M_current = _Var12._M_current;
              if (!bVar5) {
                _Var12._M_current = _Var12._M_current + 1;
                goto LAB_002fe4ba;
              }
              goto LAB_002fe33f;
            }
            if (lVar13 == 3) {
              bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                    *)&local_348,_Var12);
              if (!bVar5) {
                _Var12._M_current = _Var12._M_current + 1;
                goto LAB_002fe4a2;
              }
              goto LAB_002fe33f;
            }
          }
          iVar6 = (*pTVar2->_vptr_TIntermNode[0xc])(pTVar2);
          plVar8 = (long *)CONCAT44(extraout_var_01,iVar6);
          lVar10 = (**(code **)(*plVar8 + 0x108))(plVar8);
          *(ulong *)(lVar10 + 8) = (*(ulong *)(lVar10 + 8) & 0xffffffffffffff80) + 1;
          lVar10 = (**(code **)(*plVar8 + 0x108))(plVar8);
          *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) & 0xffffc01f1fffffff;
          pTVar9 = (TQualifier *)(**(code **)(*plVar8 + 0x108))(plVar8);
          TQualifier::clearLayout(pTVar9);
          ppTVar4 = unitAllInputs.
                    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppTVar14 = unitAllInputs.
                          super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppTVar14 != ppTVar4;
              ppTVar14 = ppTVar14 + 1) {
            pTVar3 = *ppTVar14;
            iVar6 = (*pTVar2->_vptr_TIntermNode[0xc])(pTVar2);
            pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x1a0))
                               ((long *)CONCAT44(extraout_var_02,iVar6));
            iVar6 = (*pTVar3->_vptr_TIntermNode[0xc])(pTVar3);
            __rhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x1a0))
                              ((long *)CONCAT44(extraout_var_03,iVar6));
            bVar5 = std::operator==(pbVar7,__rhs);
            if (bVar5) {
              iVar6 = (*pTVar3->_vptr_TIntermNode[0xc])(pTVar3);
              plVar8 = (long *)CONCAT44(extraout_var_04,iVar6);
              lVar10 = (**(code **)(*plVar8 + 0x108))(plVar8);
              *(ulong *)(lVar10 + 8) = (*(ulong *)(lVar10 + 8) & 0xffffffffffffff80) + 1;
              lVar10 = (**(code **)(*plVar8 + 0x108))(plVar8);
              *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) & 0xffffc01f1fffffff;
              pTVar9 = (TQualifier *)(**(code **)(*plVar8 + 0x108))(plVar8);
              TQualifier::clearLayout(pTVar9);
            }
          }
        }
      }
LAB_002fe344:
      allOutputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = local_338 + 1;
    }
    TLiveTraverser::~TLiveTraverser(&unitAllTraverser.super_TLiveTraverser);
    TLiveTraverser::~TLiveTraverser(&allTraverser.super_TLiveTraverser);
    TLiveTraverser::~TLiveTraverser(&unitTraverser.super_TLiveTraverser);
  }
  return;
}

Assistant:

void TIntermediate::optimizeStageIO(TInfoSink&, TIntermediate& unit)
{
    // don't do any input/output demotion on compute, raytracing, or task/mesh stages
    // TODO: support task/mesh
    if (getStage() > EShLangFragment || unit.getStage() > EShLangFragment) {
        return;
    }

    class TIOTraverser : public TLiveTraverser {
    public:
        TIOTraverser(TIntermediate& i, bool all, TIntermSequence& sequence, TStorageQualifier storage)
            : TLiveTraverser(i, all, true, false, false), sequence(sequence), storage(storage)
        {
        }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            if (symbol->getQualifier().storage == storage) {
                sequence.push_back(symbol);
            }
        }

    private:
        TIntermSequence& sequence;
        TStorageQualifier storage;
    };

    // live symbols only
    TIntermSequence unitLiveInputs;

    TIOTraverser unitTraverser(unit, false, unitLiveInputs, EvqVaryingIn);
    unitTraverser.pushFunction(unit.getEntryPointMangledName().c_str());
    while (! unitTraverser.destinations.empty()) {
        TIntermNode* destination = unitTraverser.destinations.back();
        unitTraverser.destinations.pop_back();
        destination->traverse(&unitTraverser);
    }

    TIntermSequence allOutputs;
    TIntermSequence unitAllInputs;

    TIOTraverser allTraverser(*this, true, allOutputs, EvqVaryingOut);
    getTreeRoot()->traverse(&allTraverser);

    TIOTraverser unitAllTraverser(unit, true, unitAllInputs, EvqVaryingIn);
    unit.getTreeRoot()->traverse(&unitAllTraverser);

    // find outputs not consumed by the next stage
    std::for_each(allOutputs.begin(), allOutputs.end(), [&unitLiveInputs, &unitAllInputs](TIntermNode* output) {
        // don't do anything to builtins
        if (output->getAsSymbolNode()->getAccessName().compare(0, 3, "gl_") == 0)
            return;

        // don't demote block outputs (for now)
        if (output->getAsSymbolNode()->getBasicType() == EbtBlock)
            return;

        // check if the (loose) output has a matching loose input
        auto isMatchingInput = [output](TIntermNode* input) {
            return output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName();
        };

        // check if the (loose) output has a matching block member input
        auto isMatchingInputBlockMember = [output](TIntermNode* input) {
            // ignore loose inputs
            if (input->getAsSymbolNode()->getBasicType() != EbtBlock)
                return false;

            // don't demote loose outputs with matching input block members
            auto isMatchingBlockMember = [output](TTypeLoc type) {
                return type.type->getFieldName() == output->getAsSymbolNode()->getName();
            };
            const TTypeList* members = input->getAsSymbolNode()->getType().getStruct();
            return std::any_of(members->begin(), members->end(), isMatchingBlockMember);
        };

        // determine if the input/output pair should be demoted
        // do the faster (and more likely) loose-loose check first
        if (std::none_of(unitLiveInputs.begin(), unitLiveInputs.end(), isMatchingInput) && 
            std::none_of(unitAllInputs.begin(), unitAllInputs.end(), isMatchingInputBlockMember)) {
            // demote any input matching the output
            auto demoteMatchingInputs = [output](TIntermNode* input) {
                if (output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName()) {
                    // demote input to a plain variable
                    TIntermSymbol* symbol = input->getAsSymbolNode();
                    symbol->getQualifier().storage = EvqGlobal;
                    symbol->getQualifier().clearInterstage();
                    symbol->getQualifier().clearLayout();
                }
            };

            // demote all matching outputs to a plain variable
            TIntermSymbol* symbol = output->getAsSymbolNode();
            symbol->getQualifier().storage = EvqGlobal;
            symbol->getQualifier().clearInterstage();
            symbol->getQualifier().clearLayout();
            std::for_each(unitAllInputs.begin(), unitAllInputs.end(), demoteMatchingInputs);
        }
    });
}